

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFE.cpp
# Opt level: O1

uint16_t __thiscall Storage::Disk::HFE::seek_track(HFE *this,Address address)

{
  uint16_t uVar1;
  uint16_t uVar2;
  FileHolder *this_00;
  
  this_00 = &this->file_;
  FileHolder::seek(this_00,((long)address >> 0x20 & 0xfffffffffffffffcU) + this->track_list_offset_,
                   0);
  uVar1 = FileHolder::get16le(this_00);
  uVar2 = FileHolder::get16le(this_00);
  FileHolder::seek(this_00,(ulong)uVar1 << 9,0);
  if (address.head != 0) {
    FileHolder::seek(this_00,0x100,1);
  }
  return uVar2 >> 1;
}

Assistant:

uint16_t HFE::seek_track(Track::Address address) {
	// Get track position and length from the lookup table; data is then always interleaved
	// based on an assumption of two heads.
	file_.seek(track_list_offset_ + address.position.as_int() * 4, SEEK_SET);

	long track_offset = long(file_.get16le()) << 9;		// Track offset, in units of 512 bytes.
	uint16_t track_length = file_.get16le();			// Track length, in bytes, containing both the front and back track.

	file_.seek(track_offset, SEEK_SET);
	if(address.head) file_.seek(256, SEEK_CUR);

	return track_length / 2;	// Divide by two to give the track length for a single side.
}